

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_messages.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  pointer pMVar2;
  hrgls_Status hVar3;
  hrgls_MessageLevel hVar4;
  hrgls_MessageLevel hVar5;
  ostream *poVar6;
  char *pcVar7;
  int iVar8;
  pointer copy;
  timeval tVar9;
  timeval tVar10;
  API api;
  size_t count;
  __time_t local_90;
  Message m;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> messages;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)hrgls::ANONYMOUS_USER_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)hrgls::NO_CREDENTIALS);
  hrgls::API::API(&api,&local_50,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68)
  ;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  hVar3 = hrgls::API::GetStatus(&api);
  if (hVar3 == 0) {
    count = 0;
    hrgls::API::SetLogMessageCallback(&api,HandleMessageCallback,&count);
    hVar3 = hrgls::API::GetStatus(&api);
    if (hVar3 == 0) {
      hrgls::API::SetLogMessageStreamingState(&api,true);
      hVar3 = hrgls::API::GetStatus(&api);
      if (hVar3 == 0) {
        tVar9 = hrgls::API::GetCurrentSystemTime(&api);
        do {
          if (4 < count) {
            hrgls::API::SetLogMessageStreamingState(&api,false);
            hVar3 = hrgls::API::GetStatus(&api);
            if (hVar3 != 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state off: ");
              pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<(poVar6,pcVar7);
              std::endl<char,std::char_traits<char>>(poVar6);
              iVar8 = 5;
              goto LAB_0010526e;
            }
            hrgls::API::SetLogMessageCallback(&api,(LogMessageCallback)0x0,(void *)0x0);
            hVar3 = hrgls::API::GetStatus(&api);
            if (hVar3 != 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,"Could not reset callback handler: ");
              pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<(poVar6,pcVar7);
              std::endl<char,std::char_traits<char>>(poVar6);
              iVar8 = 6;
              goto LAB_0010526e;
            }
            hrgls::API::SetLogMessageMinimumLevel(&api,0);
            hVar3 = hrgls::API::GetStatus(&api);
            if (hVar3 != 0) {
              poVar6 = std::operator<<((ostream *)&std::cerr,"Could not set minimum message level: "
                                      );
              pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<(poVar6,pcVar7);
              std::endl<char,std::char_traits<char>>(poVar6);
              iVar8 = 100;
              goto LAB_0010526e;
            }
            hrgls::API::SetLogMessageStreamingState(&api,true);
            hVar3 = hrgls::API::GetStatus(&api);
            if (hVar3 == 0) {
              count = 0;
              tVar9 = hrgls::API::GetCurrentSystemTime(&api);
              local_90 = tVar9.tv_sec;
              iVar8 = 0;
              goto LAB_001052af;
            }
            poVar6 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state on: ");
            pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
            poVar6 = std::operator<<(poVar6,pcVar7);
            std::endl<char,std::char_traits<char>>(poVar6);
            iVar8 = 7;
            goto LAB_0010526e;
          }
          tVar10 = hrgls::API::GetCurrentSystemTime(&api);
        } while (tVar10.tv_sec - tVar9.tv_sec < 6);
        poVar6 = std::operator<<((ostream *)&std::cerr,
                                 "Timeout waiting for callback-based messages.");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar8 = 4;
      }
      else {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state on: ");
        pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar8 = 3;
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,"Could not set callback handler: ");
      pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
      poVar6 = std::operator<<(poVar6,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar6);
      iVar8 = 2;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Could not Open API: ");
    pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar8 = 1;
  }
  goto LAB_0010526e;
  while (count < 5) {
LAB_001052af:
    hrgls::API::GetPendingLogMessages(&messages,&api,0);
    hVar3 = hrgls::API::GetStatus(&api);
    pMVar2 = messages.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (hVar3 == 1) {
LAB_001053ab:
      tVar9 = hrgls::API::GetCurrentSystemTime(&api);
      bVar1 = true;
      if (5 < tVar9.tv_sec - local_90) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Timeout waiting for get-based messages.");
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar8 = 9;
LAB_001053e1:
        bVar1 = false;
      }
    }
    else {
      if (hVar3 != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"Error reading messages: ");
        pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
        poVar6 = std::operator<<(poVar6,pcVar7);
        std::endl<char,std::char_traits<char>>(poVar6);
        iVar8 = 8;
        goto LAB_001053e1;
      }
      count = count + ((long)messages.
                             super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)messages.
                             super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3);
      copy = messages.super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>._M_impl.
             super__Vector_impl_data._M_start;
      do {
        if (copy == pMVar2) goto LAB_001053ab;
        hrgls::Message::Message(&m,copy);
        hVar4 = hrgls::Message::Level(&m);
        if (hVar4 < 0) {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Too-low message level: ");
          hVar5 = hrgls::Message::Level(&m);
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,hVar5);
          std::endl<char,std::char_traits<char>>(poVar6);
          iVar8 = 0x65;
        }
        hrgls::Message::~Message(&m);
        copy = copy + 1;
      } while (-1 < hVar4);
      bVar1 = false;
    }
    std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(&messages);
    if (!bVar1) goto LAB_0010526e;
  }
  hrgls::API::SetLogMessageStreamingState(&api,false);
  hVar3 = hrgls::API::GetStatus(&api);
  if (hVar3 == 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Success!");
    iVar8 = 0;
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Could not set streaming state off: ");
    pcVar7 = (char *)hrgls_ErrorMessage(hVar3);
    poVar6 = std::operator<<(poVar6,pcVar7);
    std::endl<char,std::char_traits<char>>(poVar6);
    iVar8 = 10;
  }
LAB_0010526e:
  hrgls::API::~API(&api);
  return iVar8;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object and, specifying default parameters.
  hrgls::API api;
  hrgls_Status status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not Open API: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 1;
  }

  size_t count = 0;
  { /// Read messages using a callback handler.

    // Set a callback handler for incoming messages and then start streaming.
    api.SetLogMessageCallback(HandleMessageCallback, &count);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 2;
    }
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 3;
    }

    // Run until we have 5 messages or we time out.
    struct timeval start = api.GetCurrentSystemTime();
    while (count < 5) {
      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for callback-based messages." << std::endl;
        return 4;
      }
    };

    // Unhook the callback handler after stopping the stream.
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 5;
    }
    api.SetLogMessageCallback(nullptr, nullptr);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not reset callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 6;
    }
  }

  // Set a minimum threshold for the messages at warning for the
  // get-based test and ensure that we don't get any messages with
  // lower level than that.

  api.SetLogMessageMinimumLevel(hrgls_MESSAGE_MINIMUM_WARNING);
  status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not set minimum message level: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 100;
  }

  { /// Read the message without a callback handler.

    // Start streaming
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 7;
    }

    count = 0;
    struct timeval start = api.GetCurrentSystemTime();
    do {
      std::vector<hrgls::Message> messages = api.GetPendingLogMessages();
      hrgls_Status status = api.GetStatus();
      if (hrgls_STATUS_OKAY == status) {
        count += messages.size();
        // Make sure we didn't get any messages below the minimum level.
        for (auto m : messages) {
          if (m.Level() < hrgls_MESSAGE_MINIMUM_WARNING) {
            std::cerr << "Too-low message level: " << m.Level() << std::endl;
            return 101;
          }
        }
      } else if (status != hrgls_STATUS_TIMEOUT) {
        std::cerr << "Error reading messages: " << hrgls_ErrorMessage(status) << std::endl;
        return 8;
      }

      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for get-based messages." << std::endl;
        return 9;
      }

    } while (count < 5);

    // Stop streaming
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 10;
    }
  }

  std::cout << "Success!" << std::endl;
  return 0;
}